

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::plot_explicit(Plotter *this,size_t funcid,bool reverse_xy)

{
  Environment *env;
  pointer *ppPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  iterator iVar5;
  bool bVar6;
  Plotter *pPVar7;
  undefined1 auVar8 [16];
  void *pvVar9;
  key_type *pkVar10;
  pointer pAVar11;
  pointer pAVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  _Base_ptr p_Var17;
  const_iterator cVar18;
  _Rb_tree_node_base *p_Var19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  _Rb_tree_node_base *p_Var23;
  undefined7 in_register_00000011;
  long lVar24;
  pointer pFVar25;
  _Rb_tree_node_base *p_Var26;
  _Rb_tree_node_base *p_Var27;
  undefined1 in_R9B;
  int sx;
  int iVar28;
  pointer this_00;
  CritPoint *x;
  undefined1 __k [8];
  Expr *this_01;
  float fVar29;
  Plotter *pPVar30;
  Plotter *pPVar31;
  double dVar32;
  double dVar33;
  undefined8 uVar34;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double __tmp_1;
  Expr *pEVar35;
  undefined1 auVar36 [16];
  undefined4 uVar37;
  float fVar38;
  float fVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  double __tmp;
  pair<std::_Rb_tree_iterator<std::pair<double,_int>_>,_std::_Rb_tree_iterator<std::pair<double,_int>_>_>
  pVar47;
  ASTNode AVar48;
  initializer_list<nivalis::Expr::ASTNode> __l;
  uint64_t var;
  double xmin;
  double xmax;
  anon_class_56_7_ff8e18dd draw_extremum;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> to_erase;
  Expr diff_sub_expr;
  CritPoint cpt;
  double MIN_DIST_BETWEEN_ROOTS;
  double x_end;
  double ydiff;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  roots_and_extrema;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  discont;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> curr_line;
  float sx_begin;
  anon_class_48_6_1545724e draw_line;
  anon_class_24_3_b7f96783 push_critpt_if_valid;
  color ineq_color;
  undefined1 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc80;
  bool local_37a;
  byte local_379;
  ulong local_378;
  Expr *local_370;
  Plotter *local_368;
  Plotter *local_360;
  undefined1 local_358 [16];
  Expr *local_340;
  undefined8 local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  anon_class_56_7_ff8e18dd local_328;
  undefined1 local_2e8 [16];
  pointer local_2d0;
  undefined1 local_2c8 [8];
  key_type *pkStack_2c0;
  _Rb_tree_node_base *local_2b8;
  _Rb_tree_node_base *local_2b0;
  _Rb_tree_node_base *local_2a8;
  size_t local_2a0;
  Expr local_298;
  Expr local_278;
  Expr *local_258;
  Plotter *local_250;
  float local_248;
  allocator_type local_241;
  pointer local_240;
  float local_238;
  float fStack_234;
  undefined8 uStack_230;
  Plotter *local_220;
  double local_218;
  pointer local_210;
  double local_208;
  Plotter *local_200;
  Plotter *local_1f8;
  size_t local_1f0;
  uint local_1e4;
  Plotter *local_1e0;
  double local_1d8;
  Plotter *local_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  Plotter *local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  Plotter *local_1a0;
  Expr *local_198;
  Expr *local_190;
  float local_188;
  float local_184;
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  local_180;
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  local_150;
  double local_120;
  double local_118;
  Plotter *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long local_f8;
  Expr local_f0;
  Plotter *local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  color *local_b0;
  anon_class_48_6_1545724e local_a8;
  anon_class_24_3_b7f96783 local_78;
  color local_60;
  
  pFVar25 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar16 = ((long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pFVar25 >> 4) * -0x79435e50d79435e5;
  local_379 = this->max_functions_find_all_crit_points <= uVar16 &&
              uVar16 - this->max_functions_find_all_crit_points != 0;
  sVar4 = this->curr_func;
  pPVar30 = (Plotter *)(this->view).xmax;
  pPVar31 = (Plotter *)(this->view).xmin;
  local_1b8 = (Plotter *)((double)pPVar30 - (double)pPVar31);
  local_1f8 = (Plotter *)(this->view).ymax;
  local_110 = (Plotter *)(this->view).ymin;
  pPVar7 = (Plotter *)((double)local_1f8 - (double)local_110);
  uVar2 = (this->view).swid;
  uVar3 = (this->view).shigh;
  fStack_234 = (float)(int)uVar2;
  uVar15 = this->x_var;
  local_368 = pPVar31;
  local_360 = pPVar30;
  local_1d0 = pPVar7;
  local_238 = (float)(int)uVar3;
  if ((int)CONCAT71(in_register_00000011,reverse_xy) != 0) {
    uVar15 = this->y_var;
    local_368 = local_110;
    local_360 = local_1f8;
    local_1f8 = pPVar30;
    local_1d0 = local_1b8;
    local_1b8 = pPVar7;
    local_110 = pPVar31;
    local_238 = fStack_234;
    fStack_234 = (float)(int)uVar3;
  }
  local_378 = (ulong)uVar15;
  uStack_230 = 0;
  this_00 = pFVar25 + funcid;
  local_b0 = &pFVar25[funcid].line_color;
  local_37a = reverse_xy;
  local_1f0 = funcid;
  color::color::color(&local_60,local_b0);
  *local_60.a = 0.25;
  local_240 = (pointer)((double)local_1b8 * 1e-07);
  local_220 = local_1d0;
  local_78.MIN_DIST_BETWEEN_ROOTS = (double *)&local_240;
  (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->y_var] = NAN;
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_150._M_impl + 8);
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_180 + 8);
  local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
  local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.xmin = (double *)&local_368;
  local_78.xmax = (double *)&local_360;
  local_a8.curr_line =
       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&local_108;
  local_f8 = 0;
  local_108._M_allocated_capacity = 0;
  local_108._8_8_ = 0;
  local_a8.reverse_xy = &local_37a;
  local_a8.funcid = &local_1f0;
  local_258 = &pFVar25[funcid].diff;
  local_2d0 = this_00;
  local_210 = local_240;
  local_180._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180._M_impl.super__Rb_tree_header._M_header._M_left;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.func = this_00;
  local_a8.this = this;
  local_a8.ineq_color = &local_60;
  bVar13 = Expr::is_null(local_258);
  bVar21 = local_379 & sVar4 != funcid;
  local_208 = (double)local_1b8 / 20.0;
  local_218 = (double)local_220 * 1e-10;
  local_1e0 = (Plotter *)0x3e112e0be826d695;
  env = &this->env;
  if ((!bVar13) &&
     (uVar16 = ((long)(this->funcs).
                      super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->funcs).
                      super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
     uVar16 < this->max_functions_find_crit_points ||
     uVar16 - this->max_functions_find_crit_points == 0)) {
    local_c8 = fStack_234;
    fStack_c4 = fStack_234;
    fStack_c0 = fStack_234;
    fStack_bc = fStack_234;
    if (0.0 < fStack_234) {
      local_1d8 = (double)local_1b8 * 1e-09;
      this_00 = (pointer)&local_2d0->expr;
      local_190 = &local_2d0->recip;
      local_198 = &local_2d0->drecip;
      local_d8 = (Plotter *)&local_2d0->ddiff;
      iVar28 = 0;
      dVar32 = 0.0;
      uVar34 = 0;
      do {
        local_358._8_8_ = uVar34;
        local_358._0_8_ = dVar32;
        local_370 = local_340;
        if (local_37a == true) {
          iVar14 = (this->view).shigh;
          dVar32 = (this->view).ymin;
          dVar33 = ((this->view).ymax - dVar32) * (double)(iVar14 - iVar28);
        }
        else {
          dVar32 = (this->view).xmin;
          dVar33 = ((this->view).xmax - dVar32) * (double)iVar28;
          iVar14 = (this->view).swid;
        }
        local_340 = (Expr *)(dVar33 / (double)iVar14 + dVar32);
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_378] = (double)local_340;
        local_1c8 = Expr::operator()((Expr *)this_00,env);
        uStack_1c0 = extraout_XMM0_Qb;
        if (!NAN(local_1c8)) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_378] = (double)local_340;
          local_2e8._0_8_ = Expr::operator()(local_258,env);
          local_2e8._8_8_ = extraout_XMM0_Qb_00;
          if (!NAN((double)local_2e8._0_8_)) {
            uVar37 = SUB84(local_368,0);
            uVar40 = (undefined4)((ulong)local_368 >> 0x20);
            pPVar30 = local_360;
            if (bVar21 == 0) {
              local_328.this =
                   (Plotter *)
                   Expr::newton((Expr *)this_00,local_378,(double)local_340,env,(double)local_210,
                                local_218,100,(double)local_368 - local_208,
                                (double)local_360 + local_208,local_258,local_1c8,
                                (double)local_2e8._0_8_);
              local_328.var = (uint64_t *)CONCAT44(local_328.var._4_4_,3);
              uVar37 = SUB84(local_368,0);
              uVar40 = (undefined4)((ulong)local_368 >> 0x20);
              pPVar30 = local_360;
              if (((((ulong)local_328.this & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                  ((double)local_368 <= (double)local_328.this)) &&
                 ((double)local_328.this <= (double)local_360)) {
                p_Var26 = (_Rb_tree_node_base *)((long)&local_180 + 8);
                pPVar31 = (Plotter *)0x3ff0000000000000;
                p_Var19 = local_180._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var23 = p_Var26;
                if (local_180._M_impl.super__Rb_tree_header._M_header._M_parent !=
                    (_Rb_tree_node_base *)0x0) {
                  do {
                    if ((*(double *)(p_Var19 + 1) < (double)local_328.this) ||
                       ((lVar24 = 0x10, p_Var26 = p_Var19,
                        *(double *)(p_Var19 + 1) <= (double)local_328.this &&
                        (*(int *)&p_Var19[1]._M_parent < 3)))) {
                      lVar24 = 0x18;
                      p_Var26 = p_Var23;
                    }
                    p_Var19 = *(_Rb_tree_node_base **)((long)&p_Var19->_M_color + lVar24);
                    p_Var23 = p_Var26;
                  } while (p_Var19 != (_Rb_tree_node_base *)0x0);
                  if (p_Var26 == (_Rb_tree_node_base *)((long)&local_180 + 8)) {
                    pPVar31 = (Plotter *)0x3ff0000000000000;
                  }
                  else {
                    pPVar31 = (Plotter *)(*(double *)(p_Var26 + 1) - (double)local_328.this);
                  }
                }
                if (p_Var26 != local_180._M_impl.super__Rb_tree_header._M_header._M_left) {
                  local_338 = local_368;
                  local_250 = local_360;
                  local_200 = local_328.this;
                  local_1a0 = pPVar31;
                  lVar24 = std::_Rb_tree_decrement(p_Var26);
                  uVar37 = SUB84(local_338,0);
                  uVar40 = (undefined4)((ulong)local_338 >> 0x20);
                  pPVar31 = (Plotter *)((double)local_200 - *(double *)(lVar24 + 0x20));
                  pPVar30 = local_250;
                  if ((double)local_1a0 <= (double)pPVar31) {
                    pPVar31 = local_1a0;
                  }
                }
                if ((double)local_240 <= (double)pPVar31) {
                  std::
                  _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                  ::_M_insert_unique<std::pair<double,int>const&>
                            ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                              *)&local_180,(pair<double,_int> *)&local_328);
                  uVar37 = SUB84(local_368,0);
                  uVar40 = (undefined4)((ulong)local_368 >> 0x20);
                  pPVar30 = local_360;
                }
              }
            }
            local_328.this =
                 (Plotter *)
                 Expr::newton(local_190,local_378,(double)local_340,env,(double)local_210,local_218,
                              100,(double)CONCAT44(uVar40,uVar37) - local_208,
                              (double)pPVar30 + local_208,local_198,1.0 / local_1c8,
                              -(double)local_2e8._0_8_ / (local_1c8 * local_1c8));
            local_328.var = (uint64_t *)((ulong)local_328.var & 0xffffffff00000000);
            if (((((ulong)local_328.this & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                ((double)local_368 <= (double)local_328.this)) &&
               ((double)local_328.this <= (double)local_360)) {
              p_Var26 = (_Rb_tree_node_base *)((long)&local_150._M_impl + 8);
              pPVar30 = (Plotter *)0x3ff0000000000000;
              p_Var19 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var23 = p_Var26;
              if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent !=
                  (_Rb_tree_node_base *)0x0) {
                do {
                  if ((*(double *)(p_Var19 + 1) < (double)local_328.this) ||
                     ((lVar24 = 0x10, p_Var26 = p_Var19,
                      *(double *)(p_Var19 + 1) <= (double)local_328.this &&
                      (*(int *)&p_Var19[1]._M_parent < 0)))) {
                    lVar24 = 0x18;
                    p_Var26 = p_Var23;
                  }
                  p_Var19 = *(_Rb_tree_node_base **)
                             ((long)&((_Rb_tree_node_base *)&p_Var19->_M_color)->_M_color + lVar24);
                  p_Var23 = p_Var26;
                } while (p_Var19 != (_Rb_tree_node_base *)0x0);
                if ((_Rb_tree_header *)p_Var26 == (_Rb_tree_header *)((long)&local_150._M_impl + 8U)
                   ) {
                  pPVar30 = (Plotter *)0x3ff0000000000000;
                }
                else {
                  pPVar30 = (Plotter *)(*(double *)(p_Var26 + 1) - (double)local_328.this);
                }
              }
              if (p_Var26 != local_150._M_impl.super__Rb_tree_header._M_header._M_left) {
                local_338 = pPVar30;
                local_250 = local_328.this;
                lVar24 = std::_Rb_tree_decrement(p_Var26);
                pPVar30 = (Plotter *)((double)local_250 - *(double *)(lVar24 + 0x20));
                if ((double)local_338 <= (double)pPVar30) {
                  pPVar30 = local_338;
                }
              }
              if ((double)local_240 <= (double)pPVar30) {
                std::
                _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                ::_M_insert_unique<std::pair<double,int>const&>
                          ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                            *)&local_150,(pair<double,_int> *)&local_328);
              }
            }
            if (bVar21 == 0) {
              (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_378] = (double)local_340;
              dVar32 = Expr::operator()((Expr *)local_d8,env);
              if (!NAN(dVar32)) {
                local_328.this =
                     (Plotter *)
                     Expr::newton(local_258,local_378,(double)local_340,env,(double)local_210,
                                  local_218,100,(double)local_368 - local_208,
                                  (double)local_360 + local_208,(Expr *)local_d8,
                                  (double)local_2e8._0_8_,dVar32);
                local_328.var = (uint64_t *)CONCAT44(local_328.var._4_4_,4);
                if (((((ulong)local_328.this & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                    ((double)local_368 <= (double)local_328.this)) &&
                   ((double)local_328.this <= (double)local_360)) {
                  p_Var26 = (_Rb_tree_node_base *)((long)&local_180 + 8);
                  dVar32 = 1.0;
                  p_Var19 = local_180._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var23 = p_Var26;
                  if (local_180._M_impl.super__Rb_tree_header._M_header._M_parent !=
                      (_Rb_tree_node_base *)0x0) {
                    do {
                      if ((*(double *)(p_Var19 + 1) < (double)local_328.this) ||
                         ((lVar24 = 0x10, p_Var26 = p_Var19,
                          *(double *)(p_Var19 + 1) <= (double)local_328.this &&
                          (*(int *)&p_Var19[1]._M_parent < 4)))) {
                        lVar24 = 0x18;
                        p_Var26 = p_Var23;
                      }
                      p_Var19 = *(_Rb_tree_node_base **)((long)&p_Var19->_M_color + lVar24);
                      p_Var23 = p_Var26;
                    } while (p_Var19 != (_Rb_tree_node_base *)0x0);
                    if (p_Var26 == (_Rb_tree_node_base *)((long)&local_180 + 8)) {
                      dVar32 = 1.0;
                    }
                    else {
                      dVar32 = *(double *)(p_Var26 + 1) - (double)local_328.this;
                    }
                  }
                  if (p_Var26 != local_180._M_impl.super__Rb_tree_header._M_header._M_left) {
                    local_2e8._0_8_ = dVar32;
                    local_338 = local_328.this;
                    lVar24 = std::_Rb_tree_decrement(p_Var26);
                    dVar32 = (double)local_338 - *(double *)(lVar24 + 0x20);
                    if ((double)local_2e8._0_8_ <= dVar32) {
                      dVar32 = (double)local_2e8._0_8_;
                    }
                  }
                  if ((double)local_240 <= dVar32) {
                    std::
                    _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                    ::_M_insert_unique<std::pair<double,int>const&>
                              ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                                *)&local_180,(pair<double,_int> *)&local_328);
                  }
                }
              }
            }
          }
        }
        if ((iVar28 != 0) && (NAN((double)local_358._0_8_) != NAN(local_1c8))) {
          uVar37 = SUB84(local_370,0);
          uVar40 = (undefined4)((ulong)local_370 >> 0x20);
          uVar41 = 0;
          uVar42 = 0;
          uVar43 = SUB84(local_340,0);
          uVar44 = (undefined4)((ulong)local_340 >> 0x20);
          if ((double)local_340 - (double)local_370 <= local_1d8) {
            uVar45 = 0;
            uVar46 = 0;
          }
          else {
            uVar45 = 0;
            uVar46 = 0;
            pEVar35 = local_370;
            do {
              local_338 = (Plotter *)CONCAT44(uVar44,uVar43);
              dVar32 = ((double)CONCAT44(uVar44,uVar43) + (double)pEVar35) * 0.5;
              local_2e8._8_4_ = uVar45;
              local_2e8._0_8_ = dVar32;
              local_2e8._12_4_ = uVar46;
              (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_378] = dVar32;
              local_370 = pEVar35;
              uStack_330 = uVar45;
              uStack_32c = uVar46;
              dVar32 = Expr::operator()((Expr *)this_00,env);
              if (NAN(dVar32) == NAN((double)local_358._0_8_)) {
                uVar37 = local_2e8._0_4_;
                uVar40 = local_2e8._4_4_;
                uVar41 = local_2e8._8_4_;
                uVar42 = local_2e8._12_4_;
                uVar43 = (float)local_338;
                uVar44 = local_338._4_4_;
                uVar45 = uStack_330;
                uVar46 = uStack_32c;
                pEVar35 = local_2e8._0_8_;
              }
              else {
                uVar37 = SUB84(local_370,0);
                uVar40 = (undefined4)((ulong)local_370 >> 0x20);
                uVar41 = 0;
                uVar42 = 0;
                uVar43 = local_2e8._0_4_;
                uVar44 = local_2e8._4_4_;
                uVar45 = local_2e8._8_4_;
                uVar46 = local_2e8._12_4_;
                pEVar35 = local_370;
              }
            } while (local_1d8 < (double)CONCAT44(uVar44,uVar43) - (double)CONCAT44(uVar40,uVar37));
          }
          uVar16 = CONCAT44(uVar46,uVar45) & local_358._8_8_;
          auVar36._0_8_ = ~-(ulong)NAN((double)local_358._0_8_) & CONCAT44(uVar40,uVar37);
          auVar36._8_8_ = ~local_358._8_8_ & CONCAT44(uVar42,uVar41);
          auVar8._8_4_ = (int)uVar16;
          auVar8._0_8_ = CONCAT44(uVar44,uVar43) & -(ulong)NAN((double)local_358._0_8_);
          auVar8._12_4_ = (int)(uVar16 >> 0x20);
          auVar36 = auVar36 | auVar8;
          local_328.this = auVar36._0_8_;
          local_328.var = (uint64_t *)CONCAT44(local_328.var._4_4_,1);
          if ((((ulong)ABS((double)local_328.this) < 0x7ff0000000000000) &&
              ((double)local_368 <= (double)local_328.this)) &&
             ((double)local_328.this <= (double)local_360)) {
            p_Var26 = (_Rb_tree_node_base *)((long)&local_150._M_impl + 8);
            dVar32 = 1.0;
            p_Var19 = local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var23 = p_Var26;
            if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent !=
                (_Rb_tree_node_base *)0x0) {
              do {
                if ((*(double *)(p_Var19 + 1) < (double)local_328.this) ||
                   ((lVar24 = 0x10, p_Var26 = p_Var19,
                    *(double *)(p_Var19 + 1) <= (double)local_328.this &&
                    (*(int *)&p_Var19[1]._M_parent < 1)))) {
                  lVar24 = 0x18;
                  p_Var26 = p_Var23;
                }
                p_Var19 = *(_Rb_tree_node_base **)
                           ((long)&((_Rb_tree_node_base *)&p_Var19->_M_color)->_M_color + lVar24);
                p_Var23 = p_Var26;
              } while (p_Var19 != (_Rb_tree_node_base *)0x0);
              if ((_Rb_tree_header *)p_Var26 == (_Rb_tree_header *)((long)&local_150._M_impl + 8U))
              {
                dVar32 = 1.0;
              }
              else {
                dVar32 = *(double *)(p_Var26 + 1) - (double)local_328.this;
              }
            }
            local_358 = auVar36;
            if (p_Var26 != local_150._M_impl.super__Rb_tree_header._M_header._M_left) {
              local_2e8._0_8_ = dVar32;
              lVar24 = std::_Rb_tree_decrement(p_Var26);
              dVar32 = (double)local_358._0_8_ - *(double *)(lVar24 + 0x20);
              if ((double)local_2e8._0_8_ <= dVar32) {
                dVar32 = (double)local_2e8._0_8_;
              }
            }
            if ((double)local_240 <= dVar32) {
              std::
              _Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              ::_M_insert_unique<std::pair<double,int>const&>
                        ((_Rb_tree<std::pair<double,int>,std::pair<double,int>,std::_Identity<std::pair<double,int>>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
                          *)&local_150,(pair<double,_int> *)&local_328);
            }
          }
        }
        iVar28 = iVar28 + 4;
        dVar32 = local_1c8;
        uVar34 = uStack_1c0;
      } while ((float)iVar28 < local_c8);
    }
  }
  local_328.this._0_4_ = DISCONT_SCREEN;
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)&local_150,(double *)&local_368,(anon_enum_32 *)&local_328);
  local_328.this = (Plotter *)CONCAT44(local_328.this._4_4_,2);
  local_379 = bVar21;
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)&local_150,(double *)&local_360,(anon_enum_32 *)&local_328);
  pPVar30 = local_1b8;
  if ((_Rb_tree_header *)local_150._M_impl.super__Rb_tree_header._M_header._M_left !=
      (_Rb_tree_header *)((long)&local_150._M_impl + 8U)) {
    local_118 = (double)local_1b8 * 1e-06;
    local_120 = (double)local_1b8 * 1e-05;
    local_1e0 = (Plotter *)((double)local_1e0 * (double)local_220);
    local_220 = (Plotter *)((double)local_220 * 0.001);
    local_184 = (float)((double)local_1b8 * 9.999999747378752e-05);
    pEVar35 = &local_2d0->expr;
    uVar16 = 0;
    p_Var17 = local_150._M_impl.super__Rb_tree_header._M_header._M_left;
    pPVar30 = local_368;
    do {
      local_1a0 = *(Plotter **)(p_Var17 + 1);
      uVar15 = *(uint *)&p_Var17[1]._M_parent;
      pFVar25 = (pointer)(ulong)uVar15;
      if (local_37a == true) {
        dVar32 = (this->view).ymax;
        fVar29 = (float)(((double)(this->view).shigh * (dVar32 - (double)local_1a0)) /
                        (dVar32 - (this->view).ymin));
        pPVar31 = local_1a0;
        fVar39 = local_1c8._0_4_;
        local_200 = pPVar30;
        fVar38 = fVar29;
      }
      else {
        dVar32 = (this->view).xmin;
        fVar39 = (float)(((double)(this->view).swid * ((double)local_1a0 - dVar32)) /
                        ((this->view).xmax - dVar32));
        pPVar31 = pPVar30;
        fVar29 = local_1c8._0_4_;
        local_200 = local_1a0;
        fVar38 = fVar39;
      }
      local_250 = (Plotter *)CONCAT44(local_250._4_4_,fVar38);
      if (uVar16 != 0) {
        fVar38 = fVar29 + local_184;
        local_340 = (Expr *)CONCAT44(local_340._4_4_,fVar39 - local_184);
        local_370 = (Expr *)CONCAT44(local_370._4_4_,0xbf800000);
        local_338 = (Plotter *)CONCAT44(local_338._4_4_,0xbf800000);
        local_248 = fVar39;
        local_1e4 = uVar15;
        local_c8 = fVar29;
        if (fVar38 < fVar39 - local_184) {
          bVar13 = (int)this_00 != 2;
          local_d8 = local_1e0;
          if (uVar15 != 0) {
            local_d8 = local_220;
          }
          local_190 = (Expr *)(local_118 + (double)pPVar31);
          local_198 = (Expr *)((double)pPVar31 + local_120);
          uStack_d0 = 0;
          local_1b8 = (Plotter *)((ulong)local_d8 ^ 0x8000000000000000);
          uStack_1b0 = 0;
          uStack_1ac = 0x80000000;
          local_338 = (Plotter *)CONCAT44(local_338._4_4_,0xbf800000);
          local_370 = (Expr *)CONCAT44(local_370._4_4_,0xbf800000);
          do {
            local_358._0_4_ = fVar38;
            if (local_37a == true) {
              iVar28 = (this->view).shigh;
              dVar32 = (this->view).ymin;
              dVar33 = ((this->view).ymax - dVar32) * (double)((float)iVar28 - fVar38);
            }
            else {
              dVar32 = (this->view).xmin;
              dVar33 = ((this->view).xmax - dVar32) * (double)fVar38;
              iVar28 = (this->view).swid;
            }
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_378] = dVar33 / (double)iVar28 + dVar32;
            dVar32 = Expr::operator()(pEVar35,env);
            if (NAN(dVar32)) {
              local_338 = (Plotter *)CONCAT44(local_338._4_4_,0xbf800000);
              fVar38 = (float)local_358._0_4_;
            }
            else {
              dVar33 = (double)local_1f8 + (double)local_1d0;
              if ((dVar32 <= (double)local_1f8 + (double)local_1d0) &&
                 (dVar33 = dVar32, dVar32 < (double)local_110 - (double)local_1d0)) {
                dVar33 = (double)local_110 - (double)local_1d0;
              }
              if (local_37a == true) {
                dVar32 = (this->view).xmin;
                dVar33 = (double)(this->view).swid * (dVar33 - dVar32);
                dVar32 = (this->view).xmax - dVar32;
              }
              else {
                dVar32 = (this->view).ymax;
                dVar33 = (double)(this->view).shigh * (dVar32 - dVar33);
                dVar32 = dVar32 - (this->view).ymin;
              }
              local_2e8._0_4_ = (float)(dVar33 / dVar32);
              if (bVar13) {
                (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_378] = (double)local_190;
                local_1d8 = Expr::operator()(pEVar35,env);
                (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_378] = (double)local_198;
                dVar32 = Expr::operator()(pEVar35,env);
                fVar29 = (float)local_2e8._0_4_;
                if ((local_1d8 - dVar32 <= (double)local_d8) ||
                   (fVar39 = local_c8, fVar38 = 0.0, (float)local_2e8._0_4_ <= 0.0)) {
                  fVar39 = (float)local_338;
                  fVar38 = local_370._0_4_;
                  if ((local_1d8 - dVar32 < (double)local_1b8) &&
                     (fVar39 = (float)local_338, (float)local_2e8._0_4_ < local_238)) {
                    fVar39 = local_c8;
                    fVar38 = local_238;
                  }
                }
              }
              else {
                fVar29 = (float)(dVar33 / dVar32);
                fVar39 = (float)local_338;
                fVar38 = local_370._0_4_;
              }
              if (0.0 <= fVar39) {
                plot_explicit::anon_class_48_6_1545724e::operator()
                          (&local_a8,fVar39,fVar38,(float)local_358._0_4_,fVar29);
                local_370 = (Expr *)CONCAT44(local_370._4_4_,local_2e8._0_4_);
                fVar38 = (float)local_358._0_4_;
              }
              else {
                local_370 = (Expr *)CONCAT44(local_370._4_4_,fVar29);
                fVar38 = (float)local_358._0_4_;
              }
              bVar13 = false;
              local_338 = (Plotter *)CONCAT44(local_338._4_4_,fVar38);
            }
            fVar29 = 0.2;
            if (local_150._M_impl.super__Rb_tree_header._M_node_count + 0xfffffffffffffffd < 0x61) {
              if (uVar16 != 1) {
                fVar29 = 0.1;
                if (fVar38 - local_1c8._0_4_ < 1.0) goto LAB_00142e06;
              }
              if (uVar16 < local_150._M_impl.super__Rb_tree_header._M_node_count +
                           0xffffffffffffffff) {
                fVar29 = 0.1;
                if (local_250._0_4_ - fVar38 < 1.0) goto LAB_00142e06;
              }
              fVar29 = 0.2;
            }
LAB_00142e06:
            fVar38 = fVar38 + fVar29;
          } while (fVar38 < local_340._0_4_);
        }
        uVar15 = local_1e4;
        pFVar25 = (pointer)(ulong)local_1e4;
        if (local_1e4 != 2) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_378] = (double)local_200 - local_118;
          dVar32 = Expr::operator()(pEVar35,env);
          local_358._0_8_ = dVar32;
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_378] = (double)local_200 - local_120;
          dVar32 = Expr::operator()(pEVar35,env);
          uVar37 = SUB84(local_1e0,0);
          uVar40 = (undefined4)((ulong)local_1e0 >> 0x20);
          if (uVar15 != 0) {
            uVar37 = SUB84(local_220,0);
            uVar40 = (undefined4)((ulong)local_220 >> 0x20);
          }
          dVar32 = (double)local_358._0_8_ - dVar32;
          bVar13 = dVar32 == (double)CONCAT44(uVar40,uVar37);
          bVar6 = dVar32 < (double)CONCAT44(uVar40,uVar37);
          fVar29 = 0.0;
          if (local_370._0_4_ <= 0.0 || (bVar6 || bVar13)) {
            fVar29 = local_188;
          }
          fVar39 = local_248;
          if (local_370._0_4_ <= 0.0 || (bVar6 || bVar13)) {
            fVar39 = -1.0;
          }
          local_188 = local_238;
          if (-(double)CONCAT44(uVar40,uVar37) <= dVar32 || local_238 <= local_370._0_4_) {
            local_188 = fVar29;
            local_248 = fVar39;
          }
          if ((0.0 <= (float)local_338) && (0.0 <= local_248)) {
            plot_explicit::anon_class_48_6_1545724e::operator()
                      (&local_a8,(float)local_338,local_370._0_4_,local_248,local_188);
          }
        }
      }
      uVar16 = uVar16 + 1;
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      local_1c8 = (double)CONCAT44(local_1c8._4_4_,local_250._0_4_);
      this_00 = pFVar25;
      pPVar30 = local_1a0;
    } while ((_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)((long)&local_150._M_impl + 8U));
  }
  bVar21 = local_379;
  if ((8 < (ulong)(local_108._8_8_ - local_108._0_8_)) && ((local_2d0->type & 2) == 0)) {
    anon_unknown_1::buf_add_screen_polyline
              (&this->draw_buf,&this->view,
               (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
               &local_108,local_b0,local_1f0,SUB84(pPVar30,0),(bool)in_R9B,
               (bool)in_stack_fffffffffffffc78,(bool)in_stack_fffffffffffffc80);
  }
  uVar16 = ((long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
  if (uVar16 < this->max_functions_find_crit_points ||
      uVar16 - this->max_functions_find_crit_points == 0) {
    if (bVar21 == 0) {
      local_328.to_erase =
           (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_2c8;
      local_2c8 = (undefined1  [8])0x0;
      pkStack_2c0 = (key_type *)0x0;
      local_2b8 = (_Rb_tree_node_base *)0x0;
      local_328.var = &local_378;
      local_328.func = local_2d0;
      local_328.reverse_xy = &local_37a;
      local_328.ydiff = (double *)&local_1d0;
      local_328.funcid = &local_1f0;
      local_328.this = this;
      if (local_180._M_impl.super__Rb_tree_header._M_header._M_left !=
          (_Base_ptr)((long)&local_180 + 8)) {
        pEVar35 = &local_2d0->expr;
        p_Var17 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_378] = *(double *)(p_Var17 + 1);
          dVar32 = Expr::operator()(pEVar35,env);
          plot_explicit::anon_class_56_7_ff8e18dd::operator()
                    (&local_328,(CritPoint *)(p_Var17 + 1),dVar32);
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          pkVar10 = pkStack_2c0;
        } while (p_Var17 != (_Base_ptr)((long)&local_180 + 8));
        if (local_2c8 != (undefined1  [8])pkStack_2c0) {
          __k = local_2c8;
          do {
            pVar47 = std::
                     _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                     ::equal_range(&local_180,(key_type *)__k);
            std::
            _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
            ::_M_erase_aux(&local_180,(_Base_ptr)pVar47.first._M_node,
                           (_Base_ptr)pVar47.second._M_node);
            __k = (undefined1  [8])((long)__k + 0x10);
          } while (__k != (undefined1  [8])pkVar10);
        }
      }
      pEVar35 = &local_2d0->expr;
      bVar13 = Expr::is_null(pEVar35);
      if ((!bVar13) && (bVar13 = Expr::is_null(local_258), !bVar13)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_378] = 0.0;
        dVar32 = Expr::operator()(pEVar35,env);
        local_358._0_8_ = dVar32;
        if ((ulong)ABS(dVar32) < 0x7ff0000000000000) {
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (&local_78,0.0,5,
                     (set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                      *)&local_180);
          local_278.ast.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_278.ast.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_278.ast.
                                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,5);
          cVar18 = std::
                   _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                   ::find(&local_180,(key_type *)&local_278);
          if (cVar18._M_node != (_Base_ptr)((long)&local_180 + 8)) {
            plot_explicit::anon_class_56_7_ff8e18dd::operator()
                      (&local_328,(CritPoint *)&local_278,(double)local_358._0_8_);
          }
        }
      }
      if (local_2c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
      }
    }
    bVar13 = Expr::is_null(local_258);
    if (!bVar13) {
      pFVar25 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->funcs).
                      super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar25 >> 4) *
               -0x79435e50d79435e5;
      if (((uVar16 < this->max_functions_find_crit_points ||
           uVar16 - this->max_functions_find_crit_points == 0) && (bVar21 & 1) == 0) &&
         ((this->max_functions_find_all_crit_points <= uVar16 &&
           uVar16 - this->max_functions_find_all_crit_points != 0 || (local_1f0 != 0)))) {
        local_370 = &local_2d0->expr;
        local_238 = fStack_234;
        uStack_230 = CONCAT44(fStack_234,fStack_234);
        local_340 = (Expr *)((double)local_210 * 10.0);
        local_338 = (Plotter *)(local_218 * 10.0);
        local_1f8 = (Plotter *)&this->pt_markers;
        uVar16 = 0;
        do {
          this_01 = &pFVar25[uVar16].diff;
          bVar13 = Expr::is_null(this_01);
          pEVar35 = local_370;
          if (!bVar13) {
            uVar15 = local_2d0->type & 0xfffffff8;
            uVar22 = pFVar25[uVar16].type & 0xfffffff8;
            if (uVar15 == uVar22) {
              Expr::operator-(&local_278,local_370,&pFVar25[uVar16].expr);
              Expr::operator-(&local_298,local_258,this_01);
              bVar13 = Expr::is_null(&local_298);
              if (!bVar13) {
                pkStack_2c0 = (key_type *)((ulong)pkStack_2c0 & 0xffffffff00000000);
                local_2b8 = (_Rb_tree_node_base *)0x0;
                local_2b0 = (_Rb_tree_node_base *)(local_2c8 + 8);
                local_2a0 = 0;
                local_2a8 = local_2b0;
                if (0.0 < local_238) {
                  iVar28 = 0;
                  do {
                    if (local_37a == true) {
                      iVar14 = (this->view).shigh;
                      dVar32 = (this->view).ymin;
                      dVar33 = ((this->view).ymax - dVar32) * (double)(iVar14 - iVar28);
                    }
                    else {
                      dVar32 = (this->view).xmin;
                      dVar33 = ((this->view).xmax - dVar32) * (double)iVar28;
                      iVar14 = (this->view).swid;
                    }
                    local_328.this =
                         (Plotter *)
                         Expr::newton(&local_278,local_378,dVar33 / (double)iVar14 + dVar32,env,
                                      (double)local_210,local_218,100,(double)local_368 - local_208,
                                      (double)local_360 + local_208,&local_298,1.79769313486232e+308
                                      ,1.79769313486232e+308);
                    if (((((ulong)local_328.this & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                        ((double)local_368 <= (double)local_328.this)) &&
                       ((double)local_328.this <= (double)local_360)) {
                      p_Var19 = (_Rb_tree_node_base *)(local_2c8 + 8);
                      dVar32 = 1.0;
                      p_Var26 = local_2b8;
                      if (local_2b8 != (_Rb_tree_node_base *)0x0) {
                        do {
                          p_Var27 = p_Var19;
                          p_Var23 = p_Var26;
                          dVar32 = *(double *)(p_Var23 + 1);
                          p_Var19 = p_Var23;
                          if (dVar32 < (double)local_328.this) {
                            p_Var19 = p_Var27;
                          }
                          p_Var26 = (&p_Var23->_M_left)[dVar32 < (double)local_328.this];
                        } while ((&p_Var23->_M_left)[dVar32 < (double)local_328.this] !=
                                 (_Base_ptr)0x0);
                        if (p_Var19 == (_Rb_tree_node_base *)(local_2c8 + 8)) {
                          dVar32 = 1.0;
                        }
                        else {
                          if (dVar32 < (double)local_328.this) {
                            p_Var23 = p_Var27;
                          }
                          dVar32 = *(double *)(p_Var23 + 1) - (double)local_328.this;
                        }
                      }
                      if (p_Var19 != local_2b0) {
                        local_2e8._0_8_ = local_328.this;
                        local_358._0_8_ = dVar32;
                        lVar24 = std::_Rb_tree_decrement(p_Var19);
                        dVar32 = (double)local_2e8._0_8_ - *(double *)(lVar24 + 0x20);
                        if ((double)local_358._0_8_ <= dVar32) {
                          dVar32 = (double)local_358._0_8_;
                        }
                      }
                      if ((double)local_240 <= dVar32) {
                        std::
                        _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                        ::_M_insert_unique<double_const&>
                                  ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                                    *)local_2c8,(double *)&local_328);
                      }
                    }
                    iVar28 = iVar28 + 10;
                    p_Var19 = local_2b0;
                  } while ((float)iVar28 < local_238);
                  for (; p_Var19 != (_Rb_tree_node_base *)(local_2c8 + 8);
                      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
                    local_358._0_8_ = *(double *)(p_Var19 + 1);
                    (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_378] = *(double *)(p_Var19 + 1);
                    pPVar30 = (Plotter *)Expr::operator()(pEVar35,env);
                    iVar5._M_current =
                         (this->pt_markers).
                         super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_328.func = (value_type *)CONCAT44(local_328.func._4_4_,5);
                    local_328.this = (Plotter *)local_358._0_8_;
                    local_328.var = (uint64_t *)pPVar30;
                    if (local_37a == true) {
                      local_328.var = (uint64_t *)local_358._0_8_;
                      local_328.this = pPVar30;
                    }
                    local_328.funcid = (size_t *)((ulong)local_328.funcid & 0xffffffffffffff00);
                    local_328.reverse_xy = (bool *)0xffffffffffffffff;
                    local_328.ydiff = (double *)0xffffffffffffffff;
                    local_328.to_erase =
                         (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )0xffffffffffffffff;
                    if (iVar5._M_current ==
                        (this->pt_markers).
                        super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                      _M_realloc_insert<nivalis::PointMarker>
                                ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                  *)local_1f8,iVar5,(PointMarker *)&local_328);
                    }
                    else {
                      *(size_t **)&(iVar5._M_current)->passive = local_328.funcid;
                      (iVar5._M_current)->drag_var_x = 0xffffffffffffffff;
                      (iVar5._M_current)->drag_var_y = 0xffffffffffffffff;
                      *(value_type **)&(iVar5._M_current)->label = local_328.func;
                      (iVar5._M_current)->rel_func = 0xffffffffffffffff;
                      (iVar5._M_current)->x = (double)local_328.this;
                      (iVar5._M_current)->y = (double)local_328.var;
                      ppPVar1 = &(this->pt_markers).
                                 super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppPVar1 = *ppPVar1 + 1;
                    }
                  }
                }
LAB_00143c38:
                std::
                _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                             *)local_2c8);
              }
            }
            else {
              if (uVar22 + uVar15 != 8) goto LAB_00143c7f;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (&local_278.ast,&pFVar25[uVar16].expr.ast);
              uVar20 = (ulong)this->x_var;
              if (local_378 == uVar20) {
                uVar20 = (ulong)this->y_var;
              }
              local_358._0_8_ = uVar20;
              Expr::sub_var(&local_278,(uint32_t)uVar20,local_370);
              AVar48 = Expr::ASTNode::varref(local_378);
              local_f0.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)AVar48.field_1;
              local_f0.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = AVar48.opcode;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_f0;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (&local_298.ast,__l,&local_241);
              Expr::Expr((Expr *)local_2c8,&local_298.ast);
              Expr::operator-((Expr *)&local_328,&local_278,(Expr *)local_2c8);
              pAVar12 = local_278.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pAVar11 = local_278.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_278.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_328.this;
              local_278.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_328.var;
              local_278.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_328.func;
              local_328.this = (Plotter *)0x0;
              local_328.var = (uint64_t *)0x0;
              local_328.func = (value_type *)0x0;
              if (((Plotter *)pAVar11 != (Plotter *)0x0) &&
                 (operator_delete(pAVar11,(long)pAVar12 - (long)pAVar11),
                 local_328.this != (Plotter *)0x0)) {
                operator_delete(local_328.this,(long)local_328.func - (long)local_328.this);
              }
              if (local_2c8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
              }
              if ((Plotter *)
                  local_298.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start != (Plotter *)0x0) {
                operator_delete(local_298.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_298.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_298.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              Expr::optimize(&local_278,5);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (&local_298.ast,&this_01->ast);
              Expr::sub_var(&local_298,local_358._0_4_,local_370);
              Expr::operator*((Expr *)local_2c8,&local_298,local_258);
              Expr::constant(&local_f0,1.0);
              Expr::operator-((Expr *)&local_328,(Expr *)local_2c8,&local_f0);
              pAVar12 = local_298.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pAVar11 = local_298.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_298.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_328.this;
              local_298.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_328.var;
              local_298.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_328.func;
              local_328.this = (Plotter *)0x0;
              local_328.var = (uint64_t *)0x0;
              local_328.func = (pointer)0x0;
              if (((Plotter *)pAVar11 != (Plotter *)0x0) &&
                 (operator_delete(pAVar11,(long)pAVar12 - (long)pAVar11),
                 local_328.this != (Plotter *)0x0)) {
                operator_delete(local_328.this,(long)local_328.func - (long)local_328.this);
              }
              pvVar9 = (void *)CONCAT44(local_f0.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (uint32_t)
                                        local_f0.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              if (pvVar9 != (void *)0x0) {
                operator_delete(pvVar9,(long)local_f0.ast.
                                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)pvVar9);
              }
              if (local_2c8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
              }
              Expr::optimize(&local_298,5);
              bVar13 = Expr::is_null(&local_298);
              if (!bVar13) {
                pkStack_2c0 = (key_type *)((ulong)pkStack_2c0 & 0xffffffff00000000);
                local_2b8 = (_Rb_tree_node_base *)0x0;
                local_2b0 = (_Rb_tree_node_base *)(local_2c8 + 8);
                local_2a0 = 0;
                local_2a8 = local_2b0;
                if (0.0 < local_238) {
                  iVar28 = 0;
                  do {
                    if (local_37a == true) {
                      iVar14 = (this->view).shigh;
                      dVar32 = (this->view).ymin;
                      dVar33 = ((this->view).ymax - dVar32) * (double)(iVar14 - iVar28);
                    }
                    else {
                      dVar32 = (this->view).xmin;
                      dVar33 = ((this->view).xmax - dVar32) * (double)iVar28;
                      iVar14 = (this->view).swid;
                    }
                    local_328.this =
                         (Plotter *)
                         Expr::newton(&local_278,local_378,dVar33 / (double)iVar14 + dVar32,env,
                                      (double)local_340,(double)local_338,100,
                                      (double)local_368 - local_208,(double)local_360 + local_208,
                                      &local_298,1.79769313486232e+308,1.79769313486232e+308);
                    if (((((ulong)local_328.this & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                        ((double)local_368 <= (double)local_328.this)) &&
                       ((double)local_328.this <= (double)local_360)) {
                      p_Var19 = (_Rb_tree_node_base *)(local_2c8 + 8);
                      dVar32 = 1.0;
                      p_Var26 = local_2b8;
                      if (local_2b8 != (_Rb_tree_node_base *)0x0) {
                        do {
                          p_Var27 = p_Var19;
                          p_Var23 = p_Var26;
                          dVar32 = *(double *)(p_Var23 + 1);
                          p_Var19 = p_Var23;
                          if (dVar32 < (double)local_328.this) {
                            p_Var19 = p_Var27;
                          }
                          p_Var26 = (&p_Var23->_M_left)[dVar32 < (double)local_328.this];
                        } while ((&p_Var23->_M_left)[dVar32 < (double)local_328.this] !=
                                 (_Base_ptr)0x0);
                        if (p_Var19 == (_Rb_tree_node_base *)(local_2c8 + 8)) {
                          dVar32 = 1.0;
                        }
                        else {
                          if (dVar32 < (double)local_328.this) {
                            p_Var23 = p_Var27;
                          }
                          dVar32 = *(double *)(p_Var23 + 1) - (double)local_328.this;
                        }
                      }
                      if (p_Var19 != local_2b0) {
                        local_2e8._0_8_ = local_328.this;
                        local_358._0_8_ = dVar32;
                        lVar24 = std::_Rb_tree_decrement(p_Var19);
                        dVar32 = (double)local_2e8._0_8_ - *(double *)(lVar24 + 0x20);
                        if ((double)local_358._0_8_ <= dVar32) {
                          dVar32 = (double)local_358._0_8_;
                        }
                      }
                      if ((double)local_240 <= dVar32) {
                        std::
                        _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                        ::_M_insert_unique<double_const&>
                                  ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                                    *)local_2c8,(double *)&local_328);
                      }
                    }
                    iVar28 = iVar28 + 2;
                    p_Var19 = local_2b0;
                  } while ((float)iVar28 < local_238);
                  for (; p_Var19 != (_Rb_tree_node_base *)(local_2c8 + 8);
                      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
                    local_358._0_8_ = *(double *)(p_Var19 + 1);
                    (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_378] = *(double *)(p_Var19 + 1);
                    pPVar30 = (Plotter *)Expr::operator()(local_370,env);
                    iVar5._M_current =
                         (this->pt_markers).
                         super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_328.func = (value_type *)CONCAT44(local_328.func._4_4_,5);
                    local_328.this = (Plotter *)local_358._0_8_;
                    local_328.var = (uint64_t *)pPVar30;
                    if (local_37a == true) {
                      local_328.var = (uint64_t *)local_358._0_8_;
                      local_328.this = pPVar30;
                    }
                    local_328.funcid = (size_t *)((ulong)local_328.funcid & 0xffffffffffffff00);
                    local_328.reverse_xy = (bool *)0xffffffffffffffff;
                    local_328.ydiff = (double *)0xffffffffffffffff;
                    local_328.to_erase =
                         (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )0xffffffffffffffff;
                    if (iVar5._M_current ==
                        (this->pt_markers).
                        super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                      _M_realloc_insert<nivalis::PointMarker>
                                ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                  *)local_1f8,iVar5,(PointMarker *)&local_328);
                    }
                    else {
                      *(size_t **)&(iVar5._M_current)->passive = local_328.funcid;
                      (iVar5._M_current)->drag_var_x = 0xffffffffffffffff;
                      (iVar5._M_current)->drag_var_y = 0xffffffffffffffff;
                      *(value_type **)&(iVar5._M_current)->label = local_328.func;
                      (iVar5._M_current)->rel_func = 0xffffffffffffffff;
                      (iVar5._M_current)->x = (double)local_328.this;
                      (iVar5._M_current)->y = (double)local_328.var;
                      ppPVar1 = &(this->pt_markers).
                                 super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppPVar1 = *ppPVar1 + 1;
                    }
                  }
                }
                goto LAB_00143c38;
              }
            }
            if ((Plotter *)
                local_298.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (Plotter *)0x0) {
              operator_delete(local_298.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_298.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((Plotter *)
                local_278.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (Plotter *)0x0) {
              operator_delete(local_278.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_278.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_278.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
LAB_00143c7f:
          pFVar25 = (this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar20 = ((long)(this->funcs).
                          super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pFVar25 >> 4) *
                   -0x79435e50d79435e5;
          if (uVar20 < this->max_functions_find_all_crit_points ||
              uVar20 - this->max_functions_find_all_crit_points == 0) {
            uVar20 = local_1f0;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar20);
      }
    }
  }
  if ((void *)local_108._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_108._M_allocated_capacity,local_f8 - local_108._0_8_);
  }
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree(&local_180);
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree(&local_150);
  return;
}

Assistant:

void Plotter::plot_explicit(size_t funcid, bool reverse_xy) {
    const bool find_all_crit_pts = funcs.size() <= max_functions_find_all_crit_points
                                     || funcid == curr_func;

    double xdiff = view.xmax - view.xmin, ydiff = view.ymax - view.ymin;
    float swid = view.swid, shigh = view.shigh;
    double xmin = view.xmin, xmax = view.xmax;
    double ymin = view.ymin, ymax = view.ymax;
    uint64_t var = x_var;
    if (reverse_xy) {
        std::swap(xdiff, ydiff);
        std::swap(xmin, ymin);
        std::swap(xmax, ymax);
        std::swap(swid, shigh);
        var = y_var;
    }
    auto& func = funcs[funcid];
    color::color ineq_color = get_ineq_color(func.line_color);


    // Constants
    // Newton's method parameters
    const double EPS_STEP  = 1e-7 * xdiff;
    const double EPS_ABS   = 1e-10 * ydiff;
    static const int MAX_ITER  = 100;
    // Shorthand for Newton's method arguments
#define NEWTON_ARGS var, x, env, EPS_STEP, EPS_ABS, MAX_ITER, \
    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW
    // Amount x-coordinate is allowed to exceed the display boundaries
    const double NEWTON_SIDE_ALLOW = xdiff / 20.;


    // x-epsilon for domain bisection
    // (finding cutoff where function becomes undefined)
    const double DOMAIN_BISECTION_EPS = 1e-9 * xdiff;

    // Asymptote check constants:
    // Assume asymptote at discontinuity if slope between
    // x + ASYMPTOTE_CHECK_DELTA1, x + ASYMPTOTE_CHECK_DELTA2
    const double ASYMPTOTE_CHECK_DELTA1 = xdiff * 1e-6;
    const double ASYMPTOTE_CHECK_DELTA2 = xdiff * 1e-5;
    const double ASYMPTOTE_CHECK_EPS    = ydiff * 1e-9;
    // Special eps for boundary of domain
    const double ASYMPTOTE_CHECK_BOUNDARY_EPS = ydiff * 1e-3;

    // For explicit functions
    // We will draw a function segment between every pair of adjacent
    // discontinuities (including 'edge of screen')
    // x-coordinate after a discontinuity to begin drawing function
    const float DISCONTINUITY_EPS = 1e-4f * xdiff;

    // Minimum x-distance between critical points
    const double MIN_DIST_BETWEEN_ROOTS  = 1e-7 * xdiff;

    env.vars[y_var] = std::numeric_limits<double>::quiet_NaN();
    // Discontinuity/root/extremum type enum
    enum {
        DISCONT_ASYMPT = 0, // asymptote (in middle of domain, e.g. 0 of 1/x)
        DISCONT_DOMAIN,     // domain boundary (possibly asymptote, e.g. 0 of ln(x))
        DISCONT_SCREEN,     // edge of screen
        ROOT,               // root
        EXTREMUM,           // extremum
        Y_INT,              // y-intercept
    };
    // CritPoint: discontinuity/root/extremum type
    // first: x-position second: enum
    using CritPoint = std::pair<double, int>;
    // Store discontinuities
    std::set<CritPoint> discont, roots_and_extrema;
    size_t idx = 0;
    // Push check helpers
    // Push to st if no other item less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_if_valid = [&](double value, std::set<double>& st) {
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(value);
            double cdist = 1.;
            if (it != st.end()) cdist = *it - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - *itp);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) st.insert(value);
        }
    };
    // Push (value, type) to discont if no other distcontinuity's first item
    // is less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_critpt_if_valid = [&](double value,
            CritPoint::second_type type,
            std::set<CritPoint>& st) {
        auto vc = CritPoint(value, type);
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(vc);
            double cdist = 1.;
            if (it != st.end())
                cdist = it->first - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - itp->first);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) {
                st.insert(vc);
            }
        }
    };

    // Stores points in current line, which will be drawn as a polyline
    std::vector<std::array<float, 2> > curr_line;
    // Draw a line and construct markers along the line
    // to allow clicking
    auto draw_line = [&](float psx, float psy, float sx, float sy) {
        if (reverse_xy) {
            std::swap(sx, sy);
            std::swap(psx, psy);
        }
        // Draw the line
        if (curr_line.empty() ||
                (psx > curr_line.back()[0] || psy != curr_line.back()[1])) {
            if (curr_line.size() > 1 &&
                    (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
            }
            curr_line.resize(2);
            curr_line[0] = {psx, psy};
            curr_line[1] = {sx, sy};
        } else {
            curr_line.push_back({sx, sy});
        }
        // Draw inequality region
        if (func.type & Function::FUNC_TYPE_MOD_INEQ) {
            if (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            0, psy, sx, sy - psy, true, ineq_color, 0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, sy, sx - psx, view.shigh - sy, true, ineq_color,
                            0.0f, funcid);
                }
            } else {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, psy, view.swid - psx, sy - psy, true, ineq_color,
                            0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, 0, sx - psx, sy, true, ineq_color, 0.0f,
                            funcid);
                }
            }
        }
    };
    // ** Find roots, asymptotes, extrema
    if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
        double prev_x, prev_y = 0.;
        for (int sx = 0; sx < swid; sx += 4) {
            const double x = reverse_xy ? _SY_TO_Y(sx) : _SX_TO_X(sx);
            env.vars[var] = x;
            double y = func.expr(env);
            const bool is_y_nan = std::isnan(y);

            if (!is_y_nan) {
                env.vars[var] = x;
                double dy = func.diff(env);
                if (!std::isnan(dy)) {
                    if (find_all_crit_pts) {
                        double root = func.expr.newton(NEWTON_ARGS, &func.diff, y, dy);
                        push_critpt_if_valid(root, ROOT, roots_and_extrema);
                    }
                    double asymp = func.recip.newton(NEWTON_ARGS,
                            &func.drecip, 1. / y, -dy / (y*y));
                    push_critpt_if_valid(asymp, DISCONT_ASYMPT, discont);

                    if (find_all_crit_pts) {
                        env.vars[var] = x;
                        double ddy = func.ddiff(env);
                        if (!std::isnan(ddy)) {
                            double extr = func.diff.newton(NEWTON_ARGS,
                                    &func.ddiff, dy, ddy);
                            push_critpt_if_valid(extr, EXTREMUM, roots_and_extrema);
                        }
                    }
                }
            }
            if (sx) {
                const bool is_prev_y_nan = std::isnan(prev_y);
                if (is_y_nan != is_prev_y_nan) {
                    // Search for cutoff via bisection
                    double lo = prev_x, hi = x;
                    while (hi - lo > DOMAIN_BISECTION_EPS) {
                        double mi = (lo + hi) * 0.5;
                        env.vars[var] = mi; double mi_y = func.expr(env);
                        if (std::isnan(mi_y) == is_prev_y_nan) {
                            lo = mi;
                        } else {
                            hi = mi;
                        }
                    }
                    double boundary_x_not_nan_side = is_prev_y_nan ? hi : lo;
                    push_critpt_if_valid(boundary_x_not_nan_side,
                            DISCONT_DOMAIN, discont);
                }
            }
            prev_x = x; prev_y = y;
        }
    }
    // Add screen edges to discontinuities list for convenience
    discont.emplace(xmin, DISCONT_SCREEN);
    discont.emplace(xmax, DISCONT_SCREEN);

    // Previous discontinuity infop
    double prev_discont_x = xmin;
    float prev_discont_sx;
    int prev_discont_type;
    size_t as_idx = 0;

    // ** Main explicit func drawing code: draw function from discont to discont
    for (const auto& discontinuity : discont) {
        float psx = -1.f, psy = -1.f;
        double discont_x = discontinuity.first;
        int discont_type = discontinuity.second;
        float discont_sx = reverse_xy ? _Y_TO_SY(discont_x) : _X_TO_SX(discont_x);

        if (as_idx > 0) {
            bool connector = prev_discont_type != DISCONT_SCREEN;
            double x_begin = prev_discont_x, x_end = discont_x;
            float sx_begin = prev_discont_sx, sx_end = discont_sx;
            if (reverse_xy) {
                std::swap(sx_begin, sx_end);
                std::swap(x_begin, x_end);
            }
            // Draw func between asymptotes
            for (float sxd = sx_begin + DISCONTINUITY_EPS; sxd < sx_end - DISCONTINUITY_EPS;) {
                const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                env.vars[var] = x;
                double y = func.expr(env);

                if (!std::isnan(y)) {
                    if (y > ymax + ydiff) y = ymax + ydiff;
                    else if (y < ymin - ydiff) y = ymin - ydiff;
                    float sy = reverse_xy ?  _X_TO_SX(y) : _Y_TO_SY(y), sx = sxd;
                    if (connector) {
                        // Check if asymptote at previous position;
                        // if so then connect it
                        connector = false;
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA1;
                        double yp = func.expr(env);
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA2;
                        double yp2 = func.expr(env);
                        double eps = discont_type == DISCONT_ASYMPT ?
                            ASYMPTOTE_CHECK_EPS:
                            ASYMPTOTE_CHECK_BOUNDARY_EPS;
                        if (yp - yp2 > eps && sy > 0.f) {
                            psx = sx_begin;
                            psy = 0.f;
                        } else if (yp - yp2 < -eps && sy < (float)shigh) {
                            psx = sx_begin;
                            psy = static_cast<float>(shigh);
                        }
                    }
                    if (psx >= 0.0) draw_line(psx, psy, sx, sy);
                    psx = sx;
                    psy = sy;
                } else {
                    psx = -1;
                }
                if (discont.size() > 2 && discont.size() < 100) {
                    if ((as_idx > 1 && sxd - prev_discont_sx < 1.) ||
                            (as_idx < discont.size() - 1 && discont_sx - sxd < 1.)) {
                        sxd += 0.1f;
                    } else {
                        sxd += 0.2f;
                    }
                } else {
                    sxd += 0.2f;
                }
            }
            // Connect next asymptote
            if (discont_type != DISCONT_SCREEN) {
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA1;
                double yp = func.expr(env);
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA2;
                double yp2 = func.expr(env);
                float sx = -1, sy;
                double eps = discont_type == DISCONT_ASYMPT ?
                    ASYMPTOTE_CHECK_EPS:
                    ASYMPTOTE_CHECK_BOUNDARY_EPS;
                if (yp - yp2 > eps && psy > 0) {
                    sx = static_cast<float>(sx_end);
                    sy = 0.f;
                }
                if (yp - yp2 < -eps && psy < shigh) {
                    sx = sx_end;
                    sy = static_cast<float>(shigh);
                }
                if (psx >= 0.f && sx >= 0.f) {
                    draw_line(psx, psy, sx, sy);
                }
            }
        }
        ++as_idx;
        prev_discont_x = discont_x;
        prev_discont_type = discont_type;
        prev_discont_sx = discont_sx;
    }

    // Finish last line, if exists
    if (curr_line.size() > 1 && (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
        buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
    }
    if (funcs.size() <= max_functions_find_crit_points) {
        if (find_all_crit_pts) {
            std::vector<CritPoint> to_erase; // Save dubious points to delete from roots_and_extrama
            // Helper to draw roots/extrema/y-int and add a marker for it
            auto draw_extremum = [&](const CritPoint& cpt, double y) {
                env.vars[var] = cpt.first;
                double dy = func.diff(env);
                double ddy = func.ddiff(env);
                double x; int type;
                std::tie(x, type) = cpt;
                auto label =
                    type == Y_INT ? (reverse_xy ? PointMarker::LABEL_X_INT : PointMarker::LABEL_Y_INT) :
                    type == ROOT ? (reverse_xy ? PointMarker::LABEL_Y_INT : PointMarker::LABEL_X_INT) :
                    (type == EXTREMUM && ddy > 1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MIN :
                    (type == EXTREMUM && ddy < -1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MAX:
                    type == EXTREMUM ? PointMarker::LABEL_INFLECTION_PT:
                    PointMarker::LABEL_NONE;
                // Do not show
                if (label == PointMarker::LABEL_INFLECTION_PT ||
                        label == PointMarker::LABEL_NONE) {
                    to_erase.push_back(cpt);
                    return;
                }

                PointMarker ptm;
                ptm.label = label;
                ptm.y = y; ptm.x = x;
                if (reverse_xy) std::swap(ptm.x, ptm.y);
                if (type == Y_INT) label = PointMarker::LABEL_X_INT;
                else if (type == ROOT) label = PointMarker::LABEL_Y_INT;
                ptm.passive = false;
                ptm.rel_func = funcid;
                ptm.drag_var_x = ptm.drag_var_y = -1;
                pt_markers.push_back(std::move(ptm));
            };
            for (const CritPoint& cpt : roots_and_extrema) {
                env.vars[var] = cpt.first;
                double y = func.expr(env);
                draw_extremum(cpt, y);
            }
            // Delete the "dubious" points
            for (const CritPoint& x : to_erase) {
                roots_and_extrema.erase(x);
            }
            if (!func.expr.is_null() && !func.diff.is_null()) {
                env.vars[var] = 0;
                double y = func.expr(env);
                if (!std::isnan(y) && !std::isinf(y)) {
                    push_critpt_if_valid(0., Y_INT, roots_and_extrema); // y-int
                    auto cpt = CritPoint(0., Y_INT);
                    if (roots_and_extrema.count(cpt)) {
                        draw_extremum(cpt, y);
                    }
                }
            }
        }

        // Function intersection
        if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
            if (find_all_crit_pts) {
                for (size_t funcid2 = 0; funcid2 < (funcs.size() <= max_functions_find_all_crit_points
                                                    ? funcid : funcs.size()); ++funcid2) {
                    auto& func2 = funcs[funcid2];
                    if (func2.diff.is_null()) continue;
                    int ft_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
                    int f2t_nomod = func2.type & ~Function::FUNC_TYPE_MOD_ALL;
                    if (ft_nomod == f2t_nomod) {
                        // Same direction, use Newton on difference.
                        Expr sub_expr = func.expr - func2.expr;
                        Expr diff_sub_expr = func.diff - func2.diff;
                        // diff_sub_expr.optimize();
                        if (diff_sub_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 10) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = sub_expr.newton(NEWTON_ARGS, &diff_sub_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } else if (ft_nomod + f2t_nomod == 8) {
                        // Inverse direction, use Newton on composition.
                        Expr comp_expr = func2.expr;
                        auto other_var = var == x_var ? y_var  : x_var;
                        comp_expr.sub_var(other_var, func.expr);
                        comp_expr = comp_expr - Expr::AST{Expr::ASTNode::varref(var)};
                        comp_expr.optimize();

                        Expr diff_comp_expr = func2.diff;
                        diff_comp_expr.sub_var(other_var, func.expr);
                        diff_comp_expr = diff_comp_expr * func.diff - Expr::constant(1.);
                        diff_comp_expr.optimize();
                        if (diff_comp_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 2) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = comp_expr.newton(
                                    var, x, env, EPS_STEP * 10.f, EPS_ABS * 10.f, MAX_ITER,
                                    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW,
                                    &diff_comp_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } // if
                    // o.w. not supported.
                } // for funcid2
            } // if (find_all_intersections || funcid == curr_func)
        } // if (!func.diff.is_null())
    } // if (funcs.size() <= max_functions_find_crit_points)
    // * End of function intersection code
}